

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

void __thiscall
DPolyobjInterpolation::DPolyobjInterpolation(DPolyobjInterpolation *this,FPolyObj *po)

{
  uint amount;
  uint uVar1;
  uint uVar2;
  
  DObject::DObject((DObject *)this);
  (this->super_DInterpolation).Next.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).refcount = 0;
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_008904d0;
  (this->oldverts).Array = (double *)0x0;
  (this->oldverts).Most = 0;
  (this->oldverts).Count = 0;
  (this->bakverts).Array = (double *)0x0;
  (this->bakverts).Most = 0;
  (this->bakverts).Count = 0;
  this->poly = po;
  amount = (po->Vertices).Count * 2;
  if (amount == 0) {
    uVar2 = 0;
    uVar1 = 0;
  }
  else {
    TArray<double,_double>::Grow(&this->oldverts,amount);
    uVar1 = (this->bakverts).Count;
    uVar2 = (po->Vertices).Count * 2;
  }
  (this->oldverts).Count = amount;
  if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
    TArray<double,_double>::Grow(&this->bakverts,uVar2 - uVar1);
  }
  (this->bakverts).Count = uVar2;
  (*(this->super_DInterpolation).super_DObject._vptr_DObject[7])(this);
  (this->super_DInterpolation).Next.field_0 = interpolator.Head.field_0;
  if ((interpolator.Head.field_0 != (DInterpolation *)0x0) &&
     ((*(byte *)((long)interpolator.Head.field_0 + 0x20) & 0x20) == 0)) {
    *(DPolyobjInterpolation **)((long)interpolator.Head.field_0 + 0x30) = this;
  }
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  interpolator.Head.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)this;
  interpolator.count = interpolator.count + 1;
  return;
}

Assistant:

DPolyobjInterpolation::DPolyobjInterpolation(FPolyObj *po)
{
	poly = po;
	oldverts.Resize(po->Vertices.Size() << 1);
	bakverts.Resize(po->Vertices.Size() << 1);
	UpdateInterpolation ();
	interpolator.AddInterpolation(this);
}